

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_no_thread.cpp
# Opt level: O2

MPP_RET mpp_dec_control_no_thread(MppDecImpl *dec,MpiCmd cmd,void *param)

{
  MPP_RET MVar1;
  AutoMutex auto_lock;
  Autolock local_28;
  
  local_28.mLock = &dec->cmd_lock->mLock;
  local_28.mEnabled = 1;
  if ((pthread_mutex_t *)local_28.mLock != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock((pthread_mutex_t *)local_28.mLock);
  }
  dec->cmd_send = dec->cmd_send + 1;
  MVar1 = mpp_dec_proc_cfg(dec,cmd,param);
  Mutex::Autolock::~Autolock(&local_28);
  return MVar1;
}

Assistant:

MPP_RET mpp_dec_control_no_thread(MppDecImpl *dec, MpiCmd cmd, void *param)
{
    // cmd_lock is used to sync all async operations
    AutoMutex auto_lock(dec->cmd_lock->mutex());

    dec->cmd_send++;
    return mpp_dec_proc_cfg(dec, cmd, param);
}